

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

void __thiscall http::Page::Page(Page *this)

{
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__Page_0010fc90;
  this->TagDepth = 0;
  this->StartTagOpen = false;
  osThread::osThread(&this->Thread);
  std::ostream::ostream(&this->m_ostream,&this->super_streambuf);
  std::istream::istream(&this->m_istream,&this->super_streambuf);
  this->m_put_back = 5;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

http::Page::Page()
    : TagDepth(0)
    , StartTagOpen(false)
    , m_ostream(this)
    , m_istream(this)
    , m_put_back(5)
{
}